

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

bool loadSphereDataBuffers(float dt)

{
  GLenum GVar1;
  undefined1 local_1f0 [64];
  mat4 mStack_1b0;
  float_t fStack_170;
  float_t fStack_16c;
  float_t fStack_168;
  float_t fStack_164;
  float_t fStack_160;
  float_t local_15c;
  undefined8 local_158;
  vec4 vStack_150;
  float_t fStack_140;
  float_t fStack_13c;
  float_t fStack_138;
  float_t local_134;
  float_t fStack_130;
  float_t fStack_12c;
  float_t fStack_128;
  float_t fStack_124;
  float_t fStack_120;
  float_t fStack_11c;
  undefined8 uStack_118;
  vec4 vStack_110;
  float_t fStack_100;
  float_t fStack_fc;
  float_t fStack_f8;
  float_t local_f4;
  mat4 local_f0;
  mat4 view;
  mat4 viewInv;
  
  local_1f0._0_4_ = 1.0;
  local_1f0._4_4_ = 0.0;
  local_1f0._8_4_ = 0.0;
  local_1f0._12_4_ = 0.0;
  local_1f0._16_4_ = 0.0;
  local_1f0._20_4_ = 1.0;
  local_1f0._24_4_ = 0.0;
  local_1f0._28_4_ = 0.0;
  local_1f0._32_4_ = 0.0;
  local_1f0._36_4_ = 0.0;
  local_1f0._40_4_ = 1.0;
  local_1f0._44_4_ = 0.0;
  local_1f0._48_4_ = 0.0;
  local_1f0._52_4_ = 0.0;
  local_1f0._56_4_ = 0.0;
  stack0xfffffffffffffe4c = 0x3f8000003f800000;
  mStack_1b0.m[0].y = 0.0;
  mStack_1b0.m[0].z = 0.0;
  mStack_1b0.m[0].w = 0.0;
  mStack_1b0.m[1].x = 0.0;
  mStack_1b0.m[1].y = 1.0;
  mStack_1b0.m[1].z = 0.0;
  mStack_1b0.m[1].w = 0.0;
  mStack_1b0.m[2].x = 0.0;
  mStack_1b0.m[2].y = 0.0;
  mStack_1b0.m[2].z = 1.0;
  mStack_1b0.m[2].w = 0.0;
  mStack_1b0.m[3].x = 0.0;
  mStack_1b0.m[3].y = 0.0;
  mStack_1b0.m[3].z = 0.0;
  mStack_1b0.m[3].w = 1.0;
  fStack_170 = 1.0;
  fStack_16c = 0.0;
  fStack_168 = 0.0;
  fStack_164 = 0.0;
  fStack_160 = 0.0;
  local_15c = 1.0;
  local_158 = 0;
  vStack_150.x = 0.0;
  vStack_150.y = 0.0;
  vStack_150.z = 1.0;
  vStack_150.w = 0.0;
  fStack_140 = 0.0;
  fStack_13c = 0.0;
  fStack_138 = 0.0;
  local_134 = 1.0;
  fStack_130 = 1.0;
  fStack_12c = 0.0;
  fStack_128 = 0.0;
  fStack_124 = 0.0;
  fStack_120 = 0.0;
  fStack_11c = 1.0;
  uStack_118 = 0;
  vStack_110.x = 0.0;
  vStack_110.y = 0.0;
  vStack_110.z = 1.0;
  vStack_110.w = 0.0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  fStack_f8 = 0.0;
  local_f4 = 1.0;
  if (loadSphereDataBuffers(float)::first == '\0') {
    g_gl.streams[1] = djgb_create(0x100);
    loadSphereDataBuffers(float)::first = '\x01';
  }
  dja::mat4::homogeneous::perspective
            (&mStack_1b0,(g_camera.fovy * 3.1415927) / 180.0,
             (float)g_framebuffer.w / (float)g_framebuffer.h,g_camera.zNear,g_camera.zFar);
  view.m[0].x = 1.0;
  view.m[0].y = 0.0;
  view.m[0].z = 0.0;
  view.m[0].w = g_camera.pos.x;
  view.m[1].x = 0.0;
  view.m[1].y = 1.0;
  view.m[1].z = 0.0;
  view.m[1].w = g_camera.pos.y;
  view.m[2].x = 0.0;
  view.m[2].y = 0.0;
  view.m[2].z = 1.0;
  view.m[2].w = g_camera.pos.z;
  view.m[3].x = 0.0;
  view.m[3].y = 0.0;
  view.m[3].z = 0.0;
  view.m[3].w = 1.0;
  dja::mat4::homogeneous::from_mat3(&g_camera.axis);
  dja::operator*(&viewInv,&view,&local_f0);
  dja::inverse(&view,&viewInv);
  local_f0.m[0].x = 1.0;
  local_f0.m[0].y = 0.0;
  local_f0.m[0].z = 0.0;
  local_f0.m[0].w = 0.0;
  local_f0.m[1].x = 0.0;
  local_f0.m[1].y = 1.0;
  local_f0.m[1].z = 0.0;
  local_f0.m[1].w = 0.0;
  local_f0.m[2].x = 0.0;
  local_f0.m[2].y = 0.0;
  local_f0.m[2].z = 1.0;
  local_f0.m[2].w = 0.0;
  local_f0.m[3].x = 0.0;
  local_f0.m[3].y = 0.0;
  local_f0.m[3].z = 0.0;
  local_f0.m[3].w = 1.0;
  dja::operator*((mat4 *)local_1f0,&view,&local_f0);
  dja::operator*(&local_f0,&mStack_1b0,(mat4 *)local_1f0);
  fStack_140 = local_f0.m[3].x;
  fStack_13c = local_f0.m[3].y;
  fStack_138 = local_f0.m[3].z;
  local_134 = local_f0.m[3].w;
  vStack_150.x = local_f0.m[2].x;
  vStack_150.y = local_f0.m[2].y;
  vStack_150.z = local_f0.m[2].z;
  vStack_150.w = local_f0.m[2].w;
  fStack_160 = local_f0.m[1].x;
  local_15c = local_f0.m[1].y;
  local_158._0_4_ = local_f0.m[1].z;
  local_158._4_4_ = local_f0.m[1].w;
  fStack_170 = local_f0.m[0].x;
  fStack_16c = local_f0.m[0].y;
  fStack_168 = local_f0.m[0].z;
  fStack_164 = local_f0.m[0].w;
  fStack_130 = viewInv.m[0].x;
  fStack_12c = viewInv.m[0].y;
  fStack_128 = viewInv.m[0].z;
  fStack_124 = viewInv.m[0].w;
  fStack_120 = viewInv.m[1].x;
  fStack_11c = viewInv.m[1].y;
  uStack_118._0_4_ = viewInv.m[1].z;
  uStack_118._4_4_ = viewInv.m[1].w;
  vStack_110.x = viewInv.m[2].x;
  vStack_110.y = viewInv.m[2].y;
  vStack_110.z = viewInv.m[2].z;
  vStack_110.w = viewInv.m[2].w;
  fStack_100 = viewInv.m[3].x;
  fStack_fc = viewInv.m[3].y;
  fStack_f8 = viewInv.m[3].z;
  local_f4 = viewInv.m[3].w;
  djgb_to_gl(g_gl.streams[1],(mat4 *)local_1f0,(int *)0x0);
  djgb_glbindrange(g_gl.streams[1],0x8a11,1);
  GVar1 = (*glad_glGetError)();
  return GVar1 == 0;
}

Assistant:

bool loadSphereDataBuffers(float dt = 0)
{
    static bool first = true;
    struct Transform {
        dja::mat4 modelView, projection, modelViewProjection, viewInv;
    } transform;

    if (first) {
        g_gl.streams[STREAM_TRANSFORM] = djgb_create(sizeof(transform));
        first = false;
    }

    // extract view and projection matrices
    dja::mat4 projection = dja::mat4::homogeneous::perspective(
        radians(g_camera.fovy),
        (float)g_framebuffer.w / (float)g_framebuffer.h,
        g_camera.zNear,
        g_camera.zFar
    );
    dja::mat4 viewInv = dja::mat4::homogeneous::translation(g_camera.pos)
                      * dja::mat4::homogeneous::from_mat3(g_camera.axis);
    dja::mat4 view = dja::inverse(viewInv);


    // upload transformations
    transform.projection = projection;
    transform.modelView  = view * dja::mat4(1);
    transform.modelViewProjection = transform.projection * transform.modelView;
    transform.viewInv = viewInv;

    // upload planet data
    djgb_to_gl(g_gl.streams[STREAM_TRANSFORM], (const void *)&transform, NULL);
    djgb_glbindrange(g_gl.streams[STREAM_TRANSFORM],
                     GL_UNIFORM_BUFFER,
                     STREAM_TRANSFORM);

    return (glGetError() == GL_NO_ERROR);
}